

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::isFragmentShaderInterlockEnabled
          (InvocationInterlockPlacementPass *this)

{
  bool bVar1;
  IRContext *pIVar2;
  FeatureManager *pFVar3;
  InvocationInterlockPlacementPass *this_local;
  
  pIVar2 = Pass::context(&this->super_Pass);
  pFVar3 = IRContext::get_feature_mgr(pIVar2);
  bVar1 = FeatureManager::HasExtension(pFVar3,kSPV_EXT_fragment_shader_interlock);
  if (bVar1) {
    pIVar2 = Pass::context(&this->super_Pass);
    pFVar3 = IRContext::get_feature_mgr(pIVar2);
    bVar1 = FeatureManager::HasCapability(pFVar3,CapabilityFragmentShaderSampleInterlockEXT);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      pIVar2 = Pass::context(&this->super_Pass);
      pFVar3 = IRContext::get_feature_mgr(pIVar2);
      bVar1 = FeatureManager::HasCapability(pFVar3,CapabilityFragmentShaderPixelInterlockEXT);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        pIVar2 = Pass::context(&this->super_Pass);
        pFVar3 = IRContext::get_feature_mgr(pIVar2);
        bVar1 = FeatureManager::HasCapability
                          (pFVar3,CapabilityFragmentShaderShadingRateInterlockEXT);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InvocationInterlockPlacementPass::isFragmentShaderInterlockEnabled() {
  if (!context()->get_feature_mgr()->HasExtension(
          kSPV_EXT_fragment_shader_interlock)) {
    return false;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderSampleInterlockEXT)) {
    return true;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderPixelInterlockEXT)) {
    return true;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderShadingRateInterlockEXT)) {
    return true;
  }

  return false;
}